

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

int dict_filler_word(dict_t *d,s3wid_t w)

{
  int iVar1;
  int iVar2;
  
  if (d == (dict_t *)0x0) {
    __assert_fail("d",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x19d,"int dict_filler_word(dict_t *, s3wid_t)");
  }
  if ((-1 < w) && (w < d->n_word)) {
    iVar1 = d->word[(uint)w].basewid;
    iVar2 = 0;
    if (((iVar1 != d->startwid) && (iVar2 = 0, iVar1 != d->finishwid)) &&
       ((iVar1 < d->filler_start || (iVar2 = 1, d->filler_end < iVar1)))) {
      iVar2 = 0;
    }
    return iVar2;
  }
  __assert_fail("(w >= 0) && (w < d->n_word)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x19e,"int dict_filler_word(dict_t *, s3wid_t)");
}

Assistant:

int
dict_filler_word(dict_t *d, s3wid_t w)
{
    assert(d);
    assert((w >= 0) && (w < d->n_word));

    w = dict_basewid(d, w);
    if ((w == d->startwid) || (w == d->finishwid))
        return 0;
    if ((w >= d->filler_start) && (w <= d->filler_end))
        return 1;
    return 0;
}